

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O3

void __thiscall el::Configuration::Configuration(Configuration *this,Configuration *c)

{
  pointer pcVar1;
  ConfigurationType CVar2;
  
  (this->super_Loggable)._vptr_Loggable = (_func_int **)&PTR__Configuration_00125210;
  CVar2 = c->m_configurationType;
  this->m_level = c->m_level;
  this->m_configurationType = CVar2;
  (this->m_value)._M_dataplus._M_p = (pointer)&(this->m_value).field_2;
  pcVar1 = (c->m_value)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_value,pcVar1,pcVar1 + (c->m_value)._M_string_length);
  return;
}

Assistant:

Configuration::Configuration(const Configuration& c) :
  m_level(c.m_level),
  m_configurationType(c.m_configurationType),
  m_value(c.m_value) {
}